

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ProxyListener::ProxyListener(ProxyListener *this,string *host,uint port)

{
  long lVar1;
  undefined1 *puVar2;
  char *local_50;
  uint port_local;
  string *host_local;
  ProxyListener *this_local;
  
  osc::OscPacketListener::OscPacketListener(&this->super_OscPacketListener);
  (this->super_OscPacketListener).super_PacketListener._vptr_PacketListener =
       (_func_int **)&PTR__ProxyListener_001188e0;
  std::shared_ptr<UdpTransmitSocket>::shared_ptr(&this->proxy_);
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  this->port_ = port;
  local_50 = this->buffer_;
  puVar2 = &this->field_0x43c;
  do {
    *local_50 = '\0';
    local_50 = local_50 + 1;
  } while (local_50 != puVar2);
  this->buffer_[0] = '\0';
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    connect(this,(int)host,(sockaddr *)(ulong)port,(socklen_t)puVar2);
  }
  return;
}

Assistant:

ProxyListener(const std::string &host, unsigned port)
            : host_(host), port_(port) {
        buffer_[0] = 0;
        if (host.length() > 0) {
            connect(host, port);
        }
    }